

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_EscapeEncoding.cpp
# Opt level: O2

size_t axl::enc::EscapeEncodingDynamic::decode
                 (CharCodec *codec,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,void *p0,
                 size_t size)

{
  int c;
  size_t sVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  int *piVar7;
  ulong unaff_R15;
  undefined1 auVar8 [16];
  ulong uStackY_1c0;
  utf32_t *local_1a0;
  ulong local_190;
  utf32_t replace;
  uint32_t decoderState;
  ulong_t hexCode;
  Array<char,_axl::sl::ArrayDetails<char>_> encodeBuffer;
  char hexCodeString [16];
  utf32_t decodeBuffer [64];
  
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear(buffer);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve(buffer,size);
  encodeBuffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count = 0;
  decoderState = 0;
  encodeBuffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p = (char *)0x0;
  encodeBuffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_hdr = (Hdr *)0x0;
  pvVar6 = (void *)(size + (long)p0);
  iVar4 = 0;
  while (p0 < pvVar6) {
    auVar8 = (**(code **)(*(long *)codec + 0x98))
                       (codec,&decoderState,decodeBuffer,0x40,p0,(long)pvVar6 - (long)p0,0xfffd);
    if (auVar8._8_8_ == 0) break;
    p0 = (void *)((long)p0 + auVar8._8_8_);
    piVar5 = decodeBuffer;
    local_1a0 = piVar5;
    for (piVar7 = piVar5; piVar7 < decodeBuffer + auVar8._0_8_; piVar7 = piVar7 + 1) {
      c = *piVar7;
      if (iVar4 == 2) {
        bVar3 = EscapeEncodingRoot::isHexChar(c);
        piVar2 = piVar7;
        if (bVar3) {
          hexCodeString[unaff_R15] = (char)c;
          unaff_R15 = unaff_R15 + 1;
          if (unaff_R15 < local_190) goto LAB_00142acd;
          piVar2 = piVar7 + 1;
        }
        local_1a0 = piVar2;
        hexCodeString[unaff_R15] = '\0';
        hexCode = strtoul(hexCodeString,(char **)0x0,0x10);
        if (local_190 == 2) {
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::append(buffer,(char *)&hexCode,1);
          iVar4 = 0;
          local_190 = 2;
        }
        else {
          appendEncoded_utf32(codec,buffer,&encodeBuffer,(utf32_t *)&hexCode,1);
LAB_00142b11:
          iVar4 = 0;
        }
      }
      else if (iVar4 == 1) {
        if (c == 0x55) {
          uStackY_1c0 = 8;
        }
        else if (c == 0x78) {
          uStackY_1c0 = 2;
        }
        else {
          if (c != 0x75) {
            replace = EscapeEncodingRoot::findEscapeReplaceChar(c);
            local_1a0 = piVar7;
            if (replace != c) {
              appendEncoded_utf32(codec,buffer,&encodeBuffer,&replace,1);
              local_1a0 = piVar7 + 1;
            }
            goto LAB_00142b11;
          }
          uStackY_1c0 = 4;
        }
        local_190 = uStackY_1c0;
        unaff_R15 = 0;
LAB_00142acd:
        iVar4 = 2;
      }
      else if (iVar4 == 0) {
        if (c != 0x5c) goto LAB_00142b11;
        appendEncoded_utf32(codec,buffer,&encodeBuffer,local_1a0,(long)piVar5 - (long)local_1a0 >> 2
                           );
        iVar4 = 1;
      }
      piVar5 = piVar5 + 1;
    }
    if (iVar4 == 0) {
      appendEncoded_utf32(codec,buffer,&encodeBuffer,local_1a0,(long)piVar5 - (long)local_1a0 >> 2);
    }
  }
  sVar1 = (buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef
            (&encodeBuffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
  return sVar1;
}

Assistant:

size_t
EscapeEncodingDynamic::decode(
	CharCodec* codec,
	sl::Array<char>* buffer,
	const void* p0,
	size_t size
) {
	enum State {
		State_Normal = 0,
		State_Escape,
		State_Hex,
	};

	State state = State_Normal;

	buffer->clear();
	buffer->reserve(size);

	sl::Array<char> encodeBuffer;
	char hexCodeString[16];
	size_t hexCodeLen;
	size_t hexCodeMaxLen;
	ulong_t hexCode;

	uint32_t decoderState = 0;
	const char* src = (char*)p0;
	const char* srcEnd = src + size;

	while (src < srcEnd) {
		utf32_t decodeBuffer[64];

		ConvertLengthResult result = codec->decode_utf32(
			&decoderState,
			decodeBuffer,
			countof(decodeBuffer),
			src,
			srcEnd - src
		);

		if (!result.m_srcLength)
			break;

		src += result.m_srcLength;

		const utf32_t* p = decodeBuffer;
		const utf32_t* end = p + result.m_dstLength;
		const utf32_t* base = p;

		for (; p < end; p++) {
			utf32_t c = *p;

			switch (state) {
			case State_Normal:
				if (c == '\\') {
					appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
					state = State_Escape;
				}

				break;

			case State_Escape:
				switch (c) {
				case 'x':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 2;
					break;

				case 'u':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 4;
					break;

				case 'U':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 8;
					break;

				default:
					utf32_t replace = findEscapeReplaceChar(c);
					if (replace != c) {
						appendEncoded_utf32(codec, buffer, &encodeBuffer, &replace, 1);
						base = p + 1;
					} else {
						base = p;
					}

					state = State_Normal;
				}

				break;

			case State_Hex:
				if (isHexChar(c)) {
					hexCodeString[hexCodeLen++] = (char)c;
					if (hexCodeLen < hexCodeMaxLen)
						break;

					base = p + 1;
				} else {
					base = p;
				}

				hexCodeString[hexCodeLen] = 0;
				hexCode = strtoul(hexCodeString, NULL, 16);

				if (hexCodeMaxLen == 2) // \x
					buffer->append((const char*)&hexCode, 1);
				else // \u or \U
					appendEncoded_utf32(codec, buffer, &encodeBuffer, (utf32_t*)&hexCode, 1);

				state = State_Normal;
				break;
			}
		}

		if (state == State_Normal) // otherwise, unterminated escape
			appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
	}

	return buffer->getCount();
}